

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMainParseLoop
          (MessageGenerator *this,Printer *printer,bool use_parse_context)

{
  bool bVar1;
  Type type;
  int iVar2;
  uint32_t u32;
  char *pcVar3;
  mapped_type *this_00;
  ulong uVar4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar5;
  size_type sVar6;
  const_reference ppFVar7;
  FieldGeneratorBase *__p;
  pointer pFVar8;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  local_198;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator;
  string local_160;
  AlphaNum local_140;
  string local_110;
  uint32_t local_f0;
  WireType local_ec;
  uint32 tag;
  WireType wt;
  FieldDescriptor *field;
  undefined1 local_d8 [4];
  int i;
  string local_a8;
  allocator local_71;
  key_type local_70;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  bool use_parse_context_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = use_parse_context;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  pcVar3 = "input";
  if ((vars._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    pcVar3 = "ref input";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"maybe_ref_input",&local_71);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_50,&local_70);
  std::__cxx11::string::operator=((string *)this_00,pcVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  io::Printer::Print<>
            (printer,"uint tag;\nwhile ((tag = input.ReadTag()) != 0) {\n  switch(tag) {\n");
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  if (this->end_tag_ != 0) {
    strings::AlphaNum::AlphaNum((AlphaNum *)local_d8,this->end_tag_);
    StrCat_abi_cxx11_(&local_a8,(protobuf *)local_d8,a);
    io::Printer::Print<char[8],std::__cxx11::string>
              (printer,"case $end_tag$:\n  return;\n",(char (*) [8])"end_tag",&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((this->has_extension_ranges_ & 1U) == 0) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "default:\n  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n  break;\n"
                      );
  }
  else {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "default:\n  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, $maybe_ref_input$)) {\n    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n  }\n  break;\n"
                      );
  }
  field._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)field._4_4_;
    pvVar5 = fields_by_number(this);
    sVar6 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(pvVar5);
    if (sVar6 <= uVar4) break;
    pvVar5 = fields_by_number(this);
    ppFVar7 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](pvVar5,(long)field._4_4_);
    _tag = *ppFVar7;
    type = FieldDescriptor::type(_tag);
    local_ec = internal::WireFormat::WireTypeForFieldType(type);
    iVar2 = FieldDescriptor::number(_tag);
    local_f0 = internal::WireFormatLite::MakeTag(iVar2,local_ec);
    bVar1 = FieldDescriptor::is_packable(_tag);
    if (bVar1) {
      iVar2 = FieldDescriptor::number(_tag);
      u32 = internal::WireFormatLite::MakeTag(iVar2,WIRETYPE_LENGTH_DELIMITED);
      strings::AlphaNum::AlphaNum(&local_140,u32);
      StrCat_abi_cxx11_(&local_110,(protobuf *)&local_140,a_00);
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"case $packed_tag$:\n",(char (*) [11])"packed_tag",&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    strings::AlphaNum::AlphaNum((AlphaNum *)&generator,local_f0);
    StrCat_abi_cxx11_(&local_160,(protobuf *)&generator,a_01);
    io::Printer::Print<char[4],std::__cxx11::string>
              (printer,"case $tag$: {\n",(char (*) [4])0x790be7,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    io::Printer::Indent(printer);
    __p = CreateFieldGeneratorInternal(this,_tag);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
                *)&local_198,__p);
    pFVar8 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->(&local_198);
    (*(pFVar8->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[9])
              (pFVar8,printer,
               (ulong)(vars._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1));
    io::Printer::Print<>(printer,"break;\n");
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n");
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr(&local_198);
    field._4_4_ = field._4_4_ + 1;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return;
}

Assistant:

void MessageGenerator::GenerateMainParseLoop(io::Printer* printer, bool use_parse_context) {
  std::map<std::string, std::string> vars;
  vars["maybe_ref_input"] = use_parse_context ? "ref input" : "input";

  printer->Print(
    "uint tag;\n"
    "while ((tag = input.ReadTag()) != 0) {\n"
    "  switch(tag) {\n");
  printer->Indent();
  printer->Indent();
  if (end_tag_ != 0) {
    printer->Print(
        "case $end_tag$:\n"
        "  return;\n",
        "end_tag", StrCat(end_tag_));
  }
  if (has_extension_ranges_) {
    printer->Print(vars,
      "default:\n"
      "  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, $maybe_ref_input$)) {\n"
      "    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n"
      "  }\n"
      "  break;\n");
  } else {
    printer->Print(vars,
      "default:\n"
      "  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n"
      "  break;\n");
  }
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    internal::WireFormatLite::WireType wt =
        internal::WireFormat::WireTypeForFieldType(field->type());
    uint32 tag = internal::WireFormatLite::MakeTag(field->number(), wt);
    // Handle both packed and unpacked repeated fields with the same Read*Array call;
    // the two generated cases are the packed and unpacked tags.
    // TODO(jonskeet): Check that is_packable is equivalent to
    // is_repeated && wt in { VARINT, FIXED32, FIXED64 }.
    // It looks like it is...
    if (field->is_packable()) {
      printer->Print(
        "case $packed_tag$:\n",
        "packed_tag",
        StrCat(
            internal::WireFormatLite::MakeTag(
                field->number(),
                internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED)));
    }

    printer->Print("case $tag$: {\n", "tag", StrCat(tag));
    printer->Indent();
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(field));
    generator->GenerateParsingCode(printer, use_parse_context);
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Outdent();
  printer->Print("}\n"); // switch
  printer->Outdent();
  printer->Print("}\n"); // while
}